

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

bool gl4cts::EnhancedLayouts::Utils::checkUniform
               (Program *program,Variable *variable,stringstream *stream)

{
  pointer *this;
  Interface *this_00;
  bool bVar1;
  string *parent_name;
  bool bVar2;
  TestError *this_01;
  Descriptor *__new_size;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  value_type pcVar7;
  reference ppcVar8;
  GLuint *pGVar9;
  ostream *poVar10;
  void *this_02;
  Descriptor *desc;
  size_t i_1;
  exception *exc;
  string *local_e8;
  string *member_name;
  string *local_c0;
  string *name;
  size_t i;
  vector<int,_std::allocator<int>_> offsets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names_str;
  vector<const_char_*,_std::allocator<const_char_*>_> names;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  size_t size;
  Interface *interface;
  bool result;
  stringstream *stream_local;
  Variable *variable_local;
  Program *program_local;
  
  bVar1 = true;
  bVar2 = Variable::IsBlock(variable);
  if (bVar2) {
    this_00 = (variable->m_descriptor).field_9.m_interface;
    __new_size = (Descriptor *)
                 std::
                 vector<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                 ::size(&this_00->m_members);
    this = &names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)
               &names_str.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&i);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,(size_type)__new_size);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)
               &names_str.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)__new_size);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,(size_type)__new_size);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&i,(size_type)__new_size);
    for (name = (string *)0x0; name < __new_size; name = (string *)&name->field_0x1) {
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)name);
      *pvVar3 = 0;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&i,(size_type)name);
      *pvVar4 = 0;
      pvVar5 = std::
               vector<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
               ::operator[](&this_00->m_members,(size_type)name);
      Variable::GetReference((string *)&member_name,&this_00->m_name,pvVar5,BASIC,0);
      local_c0 = (string *)&member_name;
      pvVar5 = std::
               vector<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
               ::operator[](&this_00->m_members,(size_type)name);
      parent_name = local_c0;
      if (pvVar5->m_type == INTERFACE) {
        pvVar5 = std::
                 vector<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                 ::operator[](&this_00->m_members,(size_type)name);
        pvVar5 = std::
                 vector<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                 ::operator[](&((pvVar5->field_9).m_interface)->m_members,0);
        Variable::GetReference((string *)&exc,parent_name,pvVar5,BASIC,0);
        local_e8 = (string *)&exc;
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,(size_type)name);
        std::__cxx11::string::operator=((string *)pvVar6,(string *)&exc);
        std::__cxx11::string::~string((string *)&exc);
      }
      else {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,(size_type)name);
        std::__cxx11::string::operator=((string *)pvVar6,(string *)parent_name);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(size_type)name);
      pcVar7 = (value_type)std::__cxx11::string::c_str();
      ppcVar8 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                           &names_str.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)name);
      *ppcVar8 = pcVar7;
      std::__cxx11::string::~string((string *)&member_name);
    }
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = (GLsizei)__new_size;
    ppcVar8 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                         &names_str.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    Program::GetUniformIndices
              (program,(GLsizei)indices.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,ppcVar8,pvVar3);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&i,0);
    Program::GetActiveUniformsiv
              (program,(GLsizei)indices.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar3,0x8a3b,
               pvVar4);
    for (desc = (Descriptor *)0x0; desc < __new_size;
        desc = (Descriptor *)((long)&desc->m_expected_component + 1)) {
      pvVar5 = std::
               vector<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
               ::operator[](&this_00->m_members,(size_type)desc);
      pGVar9 = (GLuint *)
               std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&i,(size_type)desc);
      if (*pGVar9 != pvVar5->m_offset) {
        poVar10 = std::operator<<((ostream *)(stream + 0x10),"Uniform: ");
        poVar10 = std::operator<<(poVar10,(string *)&pvVar5->m_name);
        poVar10 = std::operator<<(poVar10," - invalid offset: ");
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&i,(size_type)desc);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,*pvVar4);
        poVar10 = std::operator<<(poVar10," expected: ");
        this_02 = (void *)std::ostream::operator<<(poVar10,pvVar5->m_offset);
        std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
        bVar1 = false;
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)
               &names_str.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    return bVar1;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Not implemented",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
             ,0x476);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

bool checkUniform(Program& program, const Utils::Variable& variable, std::stringstream& stream)
{
	bool result = true;

	if (false == variable.IsBlock())
	{
		TCU_FAIL("Not implemented");
	}
	else
	{
		Utils::Interface* interface = variable.m_descriptor.m_interface;

		size_t size = interface->m_members.size();

		std::vector<GLuint>		 indices;
		std::vector<const char*> names;
		std::vector<std::string> names_str;
		std::vector<GLint>		 offsets;

		indices.resize(size);
		names.resize(size);
		names_str.resize(size);
		offsets.resize(size);

		for (size_t i = 0; i < size; ++i)
		{
			indices[i] = 0;
			offsets[i] = 0;

			const std::string& name =
				Utils::Variable::GetReference(interface->m_name, interface->m_members[i], Utils::Variable::BASIC, 0);

			if (Utils::Variable::INTERFACE == interface->m_members[i].m_type)
			{
				const std::string& member_name = Utils::Variable::GetReference(
					name, interface->m_members[i].m_interface->m_members[0], Utils::Variable::BASIC, 0);

				names_str[i] = member_name;
			}
			else
			{
				names_str[i] = name;
			}

			names[i] = names_str[i].c_str();
		}

		try
		{
			program.GetUniformIndices(static_cast<glw::GLsizei>(size), &names[0], &indices[0]);
			program.GetActiveUniformsiv(static_cast<glw::GLsizei>(size), &indices[0], GL_UNIFORM_OFFSET, &offsets[0]);
		}
		catch (std::exception& exc)
		{
			stream << "Failed to query program for uniforms in block: " << variable.m_descriptor.m_name
				   << ". Reason: " << exc.what() << "\n";

			return false;
		}

		for (size_t i = 0; i < size; ++i)
		{
			Utils::Variable::Descriptor& desc = interface->m_members[i];

			if (offsets[i] != (GLint)desc.m_offset)
			{
				stream << "Uniform: " << desc.m_name << " - invalid offset: " << offsets[i]
					   << " expected: " << desc.m_offset << std::endl;
				result = false;
			}
		}
	}

	return result;
}